

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateGeneralWeightParams
                   (Result *__return_storage_ptr__,WeightParams *weight,uint64_t expectedUnits,
                   uint64_t outChannels,string *layerClassName,string *layerName,string *weightName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  pointer pcVar6;
  uint uVar7;
  char cVar8;
  bool bVar9;
  ulong uVar10;
  long *plVar11;
  undefined8 *puVar12;
  byte bVar13;
  ulong *puVar14;
  long *plVar15;
  size_type *psVar16;
  uint64_t uVar17;
  char cVar18;
  ulong uVar19;
  uint uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str;
  Result r;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  string local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  Result local_58;
  
  Result::Result(&local_58);
  iVar3 = (weight->floatvalue_).current_size_;
  uVar10 = (ulong)iVar3;
  uVar19 = *(ulong *)(((ulong)(weight->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar20 = (0 < (long)uVar10) + 1;
  if (uVar19 == 0) {
    uVar20 = (uint)(0 < (long)uVar10);
  }
  lVar4 = *(long *)(((ulong)(weight->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(weight->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar7 = (uint)(lVar5 == 0);
  uVar20 = (uVar20 - (lVar4 == 0)) + 2;
  bVar13 = 4;
  if (uVar20 - uVar7 < 2) {
    bVar13 = 5;
    if (uVar20 != uVar7) {
      bVar13 = iVar3 < 1;
    }
    if (((((uVar19 == 0) && (uVar20 != uVar7)) && (iVar3 < 1)) &&
        (((lVar4 == 0 || (weight == (WeightParams *)Specification::_WeightParams_default_instance_))
         || (bVar13 = 2, weight->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (weight == (WeightParams *)Specification::_WeightParams_default_instance_))
        || (bVar13 = 3, weight->quantization_ == (QuantizationParams *)0x0)))) {
      bVar13 = 5;
    }
  }
  if (bVar13 < 2) {
    uVar19 = uVar19 >> 1;
    if (bVar13 == 0) {
      uVar19 = uVar10;
    }
    if (uVar19 == expectedUnits) {
LAB_0037812e:
      paVar2 = &local_58.m_message.field_2;
      __return_storage_ptr__->m_type = local_58.m_type;
      __return_storage_ptr__->m_reason = local_58.m_reason;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_message._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                      local_58.m_message.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
             local_58.m_message.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_58.m_message._M_dataplus._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                      local_58.m_message.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_58.m_message._M_string_length;
      local_58.m_message._M_string_length = 0;
      local_58.m_message.field_2._M_local_buf[0] = '\0';
      local_58.m_message._M_dataplus._M_p = (pointer)paVar2;
      goto LAB_003789df;
    }
    local_78[0] = local_68;
    pcVar6 = (layerClassName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar6,pcVar6 + layerClassName->_M_string_length);
    std::__cxx11::string::append((char *)local_78);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_78,(ulong)(layerName->_M_dataplus)._M_p);
    puVar14 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar14) {
      local_108 = *puVar14;
      lStack_100 = plVar11[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *puVar14;
      local_118 = (ulong *)*plVar11;
    }
    local_110 = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_f8 = &local_e8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_e8 = *plVar15;
      lStack_e0 = plVar11[3];
    }
    else {
      local_e8 = *plVar15;
      local_f8 = (long *)*plVar11;
    }
    local_f0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)(weightName->_M_dataplus)._M_p);
    local_d8 = &local_c8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_c8 = *plVar15;
      lStack_c0 = plVar11[3];
    }
    else {
      local_c8 = *plVar15;
      local_d8 = (long *)*plVar11;
    }
    local_d0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
    puVar14 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar14) {
      local_1a8 = *puVar14;
      lStack_1a0 = plVar11[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *puVar14;
      local_1b8 = (ulong *)*plVar11;
    }
    local_1b0 = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    cVar18 = '\x01';
    if (9 < uVar19) {
      uVar10 = uVar19;
      cVar8 = '\x04';
      do {
        cVar18 = cVar8;
        if (uVar10 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_00378a1c;
        }
        if (uVar10 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_00378a1c;
        }
        if (uVar10 < 10000) goto LAB_00378a1c;
        bVar9 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar8 = cVar18 + '\x04';
      } while (bVar9);
      cVar18 = cVar18 + '\x01';
    }
LAB_00378a1c:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,uVar19);
    uVar19 = CONCAT44(uStack_8c,local_90) + local_1b0;
    uVar10 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar10 = local_1a8;
    }
    if (uVar10 < uVar19) {
      uVar10 = 0xf;
      if (local_98 != local_88) {
        uVar10 = local_88[0];
      }
      if (uVar10 < uVar19) goto LAB_00378a96;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_00378a96:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_98);
    }
    local_158 = &local_148;
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_148 = *plVar11;
      uStack_140 = puVar12[3];
    }
    else {
      local_148 = *plVar11;
      local_158 = (long *)*puVar12;
    }
    local_150 = puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)plVar11 = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar14 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar14) {
      local_168 = *puVar14;
      lStack_160 = plVar11[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar14;
      local_178 = (ulong *)*plVar11;
    }
    local_170 = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    cVar18 = '\x01';
    if (9 < expectedUnits) {
      uVar17 = expectedUnits;
      cVar8 = '\x04';
      do {
        cVar18 = cVar8;
        if (uVar17 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_00378bb9;
        }
        if (uVar17 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_00378bb9;
        }
        if (uVar17 < 10000) goto LAB_00378bb9;
        bVar9 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        cVar8 = cVar18 + '\x04';
      } while (bVar9);
      cVar18 = cVar18 + '\x01';
    }
LAB_00378bb9:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,expectedUnits);
    uVar19 = CONCAT44(uStack_ac,local_b0) + local_170;
    uVar10 = 0xf;
    if (local_178 != &local_168) {
      uVar10 = local_168;
    }
    if (uVar10 < uVar19) {
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < uVar19) goto LAB_00378c33;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_178);
    }
    else {
LAB_00378c33:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_b8);
    }
    local_198 = &local_188;
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_188 = *plVar11;
      uStack_180 = puVar12[3];
    }
    else {
      local_188 = *plVar11;
      local_198 = (long *)*puVar12;
    }
    local_190 = puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)plVar11 = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_138.field_2._M_allocated_capacity = *psVar16;
      local_138.field_2._8_8_ = puVar12[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar16;
      local_138._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_138._M_string_length = puVar12[1];
    *puVar12 = psVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_138);
LAB_003793c9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_003789df;
  }
  else {
    if (bVar13 != 4) {
      if (bVar13 != 2) {
        pcVar6 = (layerClassName->_M_dataplus)._M_p;
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar6,pcVar6 + layerClassName->_M_string_length);
        std::__cxx11::string::append((char *)&local_1b8);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b8,(ulong)(layerName->_M_dataplus)._M_p);
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_148 = *plVar11;
          uStack_140 = puVar12[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar11;
          local_158 = (long *)*puVar12;
        }
        local_150 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar14) {
          local_168 = *puVar14;
          lStack_160 = plVar11[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *puVar14;
          local_178 = (ulong *)*plVar11;
        }
        local_170 = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_178,(ulong)(weightName->_M_dataplus)._M_p);
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_188 = *plVar11;
          uStack_180 = puVar12[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar11;
          local_198 = (long *)*puVar12;
        }
        local_190 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138.field_2._8_8_ = puVar12[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_138._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_138);
        goto LAB_003789c2;
      }
      bVar9 = hasSufficientBytesInQuantizedWeightParam(weight,expectedUnits);
      if (bVar9) {
        bVar9 = hasValidQuantizationParams(weight,(int)outChannels);
        if (bVar9) goto LAB_0037812e;
        pcVar6 = (layerClassName->_M_dataplus)._M_p;
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar6,pcVar6 + layerClassName->_M_string_length);
        std::__cxx11::string::append((char *)&local_1b8);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b8,(ulong)(layerName->_M_dataplus)._M_p);
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_148 = *plVar11;
          uStack_140 = puVar12[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar11;
          local_158 = (long *)*puVar12;
        }
        local_150 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar14) {
          local_168 = *puVar14;
          lStack_160 = plVar11[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *puVar14;
          local_178 = (ulong *)*plVar11;
        }
        local_170 = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_178,(ulong)(weightName->_M_dataplus)._M_p);
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_188 = *plVar11;
          uStack_180 = puVar12[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar11;
          local_198 = (long *)*puVar12;
        }
        local_190 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138.field_2._8_8_ = puVar12[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_138._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_138);
        goto LAB_003789c2;
      }
      pcVar6 = (layerClassName->_M_dataplus)._M_p;
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar6,pcVar6 + layerClassName->_M_string_length);
      std::__cxx11::string::append((char *)&local_f8);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_f8,(ulong)(layerName->_M_dataplus)._M_p);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_c8 = *plVar15;
        lStack_c0 = plVar11[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar15;
        local_d8 = (long *)*plVar11;
      }
      local_d0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_1b8 = &local_1a8;
      puVar14 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar14) {
        local_1a8 = *puVar14;
        lStack_1a0 = plVar11[3];
      }
      else {
        local_1a8 = *puVar14;
        local_1b8 = (ulong *)*plVar11;
      }
      local_1b0 = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1b8,(ulong)(weightName->_M_dataplus)._M_p);
      plVar11 = puVar12 + 2;
      if ((long *)*puVar12 == plVar11) {
        local_148 = *plVar11;
        uStack_140 = puVar12[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *plVar11;
        local_158 = (long *)*puVar12;
      }
      local_150 = puVar12[1];
      *puVar12 = plVar11;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
      puVar14 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar14) {
        local_168 = *puVar14;
        lStack_160 = plVar11[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *puVar14;
        local_178 = (ulong *)*plVar11;
      }
      local_170 = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cVar18 = '\x01';
      if (9 < expectedUnits) {
        uVar17 = expectedUnits;
        cVar8 = '\x04';
        do {
          cVar18 = cVar8;
          if (uVar17 < 100) {
            cVar18 = cVar18 + -2;
            goto LAB_003791a7;
          }
          if (uVar17 < 1000) {
            cVar18 = cVar18 + -1;
            goto LAB_003791a7;
          }
          if (uVar17 < 10000) goto LAB_003791a7;
          bVar9 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar8 = cVar18 + '\x04';
        } while (bVar9);
        cVar18 = cVar18 + '\x01';
      }
LAB_003791a7:
      local_118 = &local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_118,(uint)local_110,expectedUnits);
      uVar19 = 0xf;
      if (local_178 != &local_168) {
        uVar19 = local_168;
      }
      if (uVar19 < (ulong)(local_110 + local_170)) {
        uVar19 = 0xf;
        if (local_118 != &local_108) {
          uVar19 = local_108;
        }
        if (uVar19 < (ulong)(local_110 + local_170)) goto LAB_00379221;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_178);
      }
      else {
LAB_00379221:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_118)
        ;
      }
      local_198 = &local_188;
      plVar11 = puVar12 + 2;
      if ((long *)*puVar12 == plVar11) {
        local_188 = *plVar11;
        uStack_180 = puVar12[3];
      }
      else {
        local_188 = *plVar11;
        local_198 = (long *)*puVar12;
      }
      local_190 = puVar12[1];
      *puVar12 = plVar11;
      puVar12[1] = 0;
      *(undefined1 *)plVar11 = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar16 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_138.field_2._M_allocated_capacity = *psVar16;
        local_138.field_2._8_8_ = puVar12[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar16;
        local_138._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_138._M_string_length = puVar12[1];
      *puVar12 = psVar16;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if (local_198 != &local_188) {
        operator_delete(local_198,local_188 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_138);
      goto LAB_003793c9;
    }
    pcVar6 = (layerClassName->_M_dataplus)._M_p;
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar6,pcVar6 + layerClassName->_M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1b8,(ulong)(layerName->_M_dataplus)._M_p);
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_148 = *plVar11;
      uStack_140 = puVar12[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar11;
      local_158 = (long *)*puVar12;
    }
    local_150 = puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar14 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar14) {
      local_168 = *puVar14;
      lStack_160 = plVar11[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar14;
      local_178 = (ulong *)*plVar11;
    }
    local_170 = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_178,(ulong)(weightName->_M_dataplus)._M_p);
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_188 = *plVar11;
      uStack_180 = puVar12[3];
      local_198 = &local_188;
    }
    else {
      local_188 = *plVar11;
      local_198 = (long *)*puVar12;
    }
    local_190 = puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_198);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_138.field_2._M_allocated_capacity = *psVar16;
      local_138.field_2._8_8_ = plVar11[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar16;
      local_138._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_138._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_138);
LAB_003789c2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_003789df;
  }
  operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
LAB_003789df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                             local_58.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateGeneralWeightParams(const CoreML::Specification::WeightParams& weight,
                                          const uint64_t expectedUnits,
                                          const uint64_t outChannels,
                                          const std::string& layerClassName,
                                          const std::string& layerName,
                                          const std::string& weightName){
    // Validate a 2D WeightParam
    Result r;
    WeightParamType wType = valueType(weight);
    uint64_t size = 0;
    if (wType == FLOAT32 || wType == FLOAT16){
        if (wType == FLOAT32){
            size = static_cast<uint64_t>(weight.floatvalue().size());
        } else {
            size = static_cast<uint64_t>(weight.float16value().size()/2);
        }
        if (size != expectedUnits){
            const std::string err = layerClassName + "Layer '" + layerName + "' has incorrect " +
            weightName + " size " + std::to_string(size) + " (expected " +
            std::to_string(expectedUnits) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == QUINT){
        if (!CoreML::hasSufficientBytesInQuantizedWeightParam(weight, expectedUnits)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has insufficient bytes for quantized " + weightName + " with " +
            std::to_string(expectedUnits) + "units.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!CoreML::hasValidQuantizationParams(weight, (int) outChannels)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has invalid quantization parameters for quantized " + weightName + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == UNSPECIFIED){
        const std::string err = layerClassName + "Layer '" + layerName + "' has unspecified " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else { // EMPTY
        const std::string err = layerClassName + "Layer '" + layerName + "' has empty " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}